

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O1

void absl::lts_20250127::internal_statusor::ThrowBadStatusOrAccess(Status *status)

{
  uintptr_t uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x38);
  uVar1 = status->rep_;
  status->rep_ = 0x37;
  *puVar2 = &PTR__BadStatusOrAccess_00853428;
  puVar2[1] = uVar1;
  *(undefined4 *)(puVar2 + 2) = 0;
  puVar2[3] = puVar2 + 5;
  puVar2[4] = 0;
  *(undefined1 *)(puVar2 + 5) = 0;
  __cxa_throw(puVar2,&BadStatusOrAccess::typeinfo,BadStatusOrAccess::~BadStatusOrAccess);
}

Assistant:

void ThrowBadStatusOrAccess(absl::Status status) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw absl::BadStatusOrAccess(std::move(status));
#else
  ABSL_INTERNAL_LOG(
      FATAL,
      absl::StrCat("Attempting to fetch value instead of handling error ",
                   status.ToString()));
  std::abort();
#endif
}